

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Chain_matrix.h
# Opt level: O3

void __thiscall
Gudhi::persistence_matrix::
Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_barcode_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true>_>_>
::_reduce_by_F(Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_barcode_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true>_>_>
               *this,Tmp_column *column,
              vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
              *chainsInF,Index currentIndex)

{
  ID_index IVar1;
  uint uVar2;
  pointer pIVar3;
  Column_settings *pCVar4;
  uint uVar5;
  long lVar6;
  iterator __position;
  uint uVar7;
  Column_support *pCVar8;
  long *plVar9;
  pair<std::_Rb_tree_iterator<std::pair<const_unsigned_int,_unsigned_int>_>,_bool> pVar10;
  uint local_4c;
  uint local_48;
  Index local_44;
  Column_settings *local_40;
  vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
  *local_38;
  
  pIVar3 = (this->matrix_).
           super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  IVar1 = pIVar3[currentIndex].super_Chain_column_option.pivot_;
  uVar7 = 0;
  if (IVar1 != 0xffffffff) {
    pCVar8 = &pIVar3[currentIndex].column_;
    do {
      pCVar8 = *(Column_support **)&(pCVar8->super_type).data_.root_plus_size_;
      uVar7 = 0;
      if (pCVar8 == &pIVar3[currentIndex].column_) goto LAB_00116c72;
    } while (*(ID_index *)(pCVar8 + 1) != IVar1);
    uVar7 = *(uint *)((long)(pCVar8 + -1) + 8);
  }
LAB_00116c72:
  pCVar4 = this->colSettings_;
  uVar2 = (pCVar4->operators).characteristic_;
  if (uVar2 <= uVar7) {
    uVar7 = uVar7 % uVar2;
  }
  local_48 = (pCVar4->operators).inverse_.
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start[uVar7];
  local_44 = currentIndex;
  local_38 = (vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
              *)chainsInF;
  lVar6 = std::_Rb_tree_decrement(&(column->_M_t)._M_impl.super__Rb_tree_header._M_header);
  local_40 = pCVar4;
  persistence_fields::Zp_field_operators<unsigned_int,_void>::multiply_inplace
            (&pCVar4->operators,&local_48,uVar2 - *(int *)(lVar6 + 0x24));
  uVar7 = local_48;
  plVar9 = *(long **)&pIVar3[currentIndex].column_.super_type.data_.root_plus_size_;
  if ((Column_support *)plVar9 != &pIVar3[currentIndex].column_) {
    pCVar4 = this->colSettings_;
    do {
      local_4c = *(uint *)(plVar9 + 2);
      pVar10 = std::
               _Rb_tree<unsigned_int,std::pair<unsigned_int_const,unsigned_int>,std::_Select1st<std::pair<unsigned_int_const,unsigned_int>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>>
               ::_M_emplace_unique<unsigned_int,unsigned_int_const&>
                         ((_Rb_tree<unsigned_int,std::pair<unsigned_int_const,unsigned_int>,std::_Select1st<std::pair<unsigned_int_const,unsigned_int>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>>
                           *)column,&local_4c,(uint *)(plVar9 + -1));
      __position._M_node = (_Base_ptr)pVar10.first._M_node;
      if (((undefined1  [16])pVar10 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        uVar5 = *(uint *)(plVar9 + -1) * uVar7 + *(int *)&__position._M_node[1].field_0x4;
        uVar2 = (pCVar4->operators).characteristic_;
        if (uVar2 <= uVar5) {
          uVar5 = uVar5 % uVar2;
        }
        *(uint *)&__position._M_node[1].field_0x4 = uVar5;
        if (uVar5 == 0) {
          std::
          _Rb_tree<unsigned_int,std::pair<unsigned_int_const,unsigned_int>,std::_Select1st<std::pair<unsigned_int_const,unsigned_int>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>>
          ::erase_abi_cxx11_((_Rb_tree<unsigned_int,std::pair<unsigned_int_const,unsigned_int>,std::_Select1st<std::pair<unsigned_int_const,unsigned_int>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>>
                              *)column,__position);
        }
      }
      else {
        persistence_fields::Zp_field_operators<unsigned_int,_void>::multiply_inplace
                  (&pCVar4->operators,(Element *)&__position._M_node[1].field_0x4,uVar7);
      }
      plVar9 = (long *)*plVar9;
    } while ((Column_support *)plVar9 != &pIVar3[currentIndex].column_);
  }
  local_4c = (local_40->operators).characteristic_ - local_48;
  std::
  vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
  ::emplace_back<unsigned_int&,unsigned_int>(local_38,&local_44,&local_4c);
  return;
}

Assistant:

inline void Chain_matrix<Master_matrix>::_reduce_by_F(Tmp_column& column,
                                                      std::vector<Entry_representative>& chainsInF,
                                                      Index currentIndex)
{
  Column& col = get_column(currentIndex);
  if constexpr (Master_matrix::Option_list::is_z2) {
    _add_to(col, column, 1u);  // Reduce with the column col_g
    chainsInF.push_back(currentIndex);
  } else {
    Field_element coef = col.get_pivot_value();
    auto& operators = colSettings_->operators;
    coef = operators.get_inverse(coef);
    operators.multiply_inplace(coef, operators.get_characteristic() - column.rbegin()->second);

    _add_to(col, column, coef);  // Reduce with the column col_g
    chainsInF.emplace_back(currentIndex, operators.get_characteristic() - coef);
  }
}